

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::write_puts(Rdma *this)

{
  A2A *a2a;
  ulong uVar1;
  ulong uVar2;
  int p;
  int pid;
  long lVar3;
  size_t size;
  size_t dst_offset;
  size_t dst_slot;
  size_t local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  a2a = &this->m_second_exchange;
  for (lVar3 = 0; lVar3 < this->m_nprocs; lVar3 = lVar3 + 1) {
    uVar1 = (this->m_recv_actions).m_get_buffer_offset.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    (this->m_second_exchange).m_recv_pos.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = 0;
    uVar2 = 0;
    while (uVar2 < uVar1) {
      pid = (int)lVar3;
      deserial<unsigned_long>(a2a,pid,&local_48);
      deserial<unsigned_long>(a2a,pid,&local_38);
      deserial<unsigned_long>(a2a,pid,&local_40);
      memcpy((void *)((long)(this->m_used_slots).
                            super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [(long)this->m_nprocs * local_38 + (long)this->m_pid].addr + local_40),
             (this->m_second_exchange).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_start +
             (this->m_second_exchange).m_recv_pos.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3] + (this->m_second_exchange).m_recv_cap * lVar3,
             local_48);
      A2A::recv_pop(a2a,pid,local_48);
      uVar2 = (this->m_second_exchange).m_recv_pos.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
    }
  }
  return;
}

Assistant:

void Rdma::write_puts()
{
#ifdef PROFILE
    TicToc t(TicToc::PUT);
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t end = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_rewind( p );
        while ( m_second_exchange.recv_pos( p ) < end ) {
            size_t size, dst_slot, dst_offset;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, dst_slot);
            deserial( m_second_exchange, p, dst_offset );
           
            char * dst_addr =
               static_cast<char *>(slot( m_pid, dst_slot ).addr );
            dst_addr += dst_offset;
            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        t.add_bytes( end );
#endif
   }
}